

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O0

void ConvertV2M(uchar *inptr,int inlen,uchar **outptr,int *outlen)

{
  byte bVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  uchar *puVar7;
  int local_ae0;
  int k;
  int modnum;
  uint8_t *src;
  int q;
  uint32_t *noffsets;
  uint32_t *poffsets;
  uint8_t *oldgptr;
  uint8_t *newptr;
  int newsize;
  int pdiff;
  int gdiff;
  int maxp2;
  int vdelta;
  ssbase base;
  int p;
  int i;
  int *outlen_local;
  uchar **outptr_local;
  int inlen_local;
  uchar *inptr_local;
  
  iVar3 = CheckV2MVersion(inptr,inlen,(ssbase *)&maxp2);
  if (iVar3 == 0) {
    puVar6 = (uchar *)operator_new__((long)(inlen + 4));
    *outptr = puVar6;
    memset(*outptr,0,(long)(inlen + 4));
    *outlen = inlen + 4;
    memcpy(*outptr,inptr,(long)inlen);
  }
  else if (iVar3 < 0) {
    *outptr = (uchar *)0x0;
    *outlen = 0;
  }
  else {
    iVar3 = v2version - iVar3;
    if (*_maxp2 / 4 != base.patchsize) {
      base.patchsize = *_maxp2 / 4;
    }
    iVar4 = v2vsizes[v2version] - v2vsizes[iVar3];
    iVar5 = inlen + (v2gsizes[v2version] - v2gsizes[iVar3]) + base.patchsize * iVar4;
    *outlen = iVar5 + 4;
    puVar6 = (uchar *)operator_new__((long)(iVar5 + 4));
    *outptr = puVar6;
    memset(puVar6,0,(long)(iVar5 + 4));
    memcpy(puVar6,inptr,(long)(int)base.mididata);
    piVar2 = _maxp2;
    puVar6 = puVar6 + (int)base.mididata;
    puVar6[0] = '\x17';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    puVar7 = puVar6 + 4;
    puVar7[0] = '@';
    puVar7[1] = '@';
    puVar7[2] = ' ';
    puVar7[3] = '\x7f';
    puVar7[4] = 'd';
    puVar7[5] = 'P';
    puVar7[6] = '@';
    puVar7[7] = '@';
    puVar6[0xc] = '\0';
    puVar6[0xd] = '\0';
    puVar6[0xe] = '@';
    puVar6[0xf] = '\0';
    puVar6[0x10] = '\x7f';
    puVar6[0x11] = '\0';
    puVar6[0x12] = '\0';
    puVar6[0x13] = '\x01';
    puVar6[0x14] = '\x02';
    puVar6[0x15] = 'Z';
    puVar6[0x16] = ' ';
    puVar6[0x17] = '\x14';
    puVar6[0x18] = '@';
    puVar6[0x19] = '@';
    puVar6[0x1a] = '\0';
    poffsets = (uint32_t *)base.patchmap;
    for (base._2652_4_ = 0; (int)base._2652_4_ < 0x17; base._2652_4_ = base._2652_4_ + 1) {
      if (v2gparms[(int)base._2652_4_].version <= iVar3) {
        puVar7[(int)base._2652_4_] = (uchar)*poffsets;
        poffsets = (uint32_t *)((long)poffsets + 1);
      }
    }
    *(int *)(puVar6 + 0x1b) = base.mididata._4_4_ + base.patchsize * iVar4;
    base._2624_8_ = puVar6 + 0x1f;
    for (src._4_4_ = 0; src._4_4_ < base.patchsize; src._4_4_ = src._4_4_ + 1) {
      *(int *)(base._2624_8_ + (long)src._4_4_ * 4) = _maxp2[src._4_4_] + src._4_4_ * iVar4;
    }
    oldgptr = (uint8_t *)(base._2624_8_ + (long)(base.patchsize << 2));
    for (base.spsize = 0; base.spsize < base.patchsize; base.spsize = base.spsize + 1) {
      _k = (byte *)((long)_maxp2 + (ulong)(uint)piVar2[base.spsize]);
      memcpy(oldgptr,"@@\x01",0x59);
      for (base._2652_4_ = 0; (int)base._2652_4_ < 0x59; base._2652_4_ = base._2652_4_ + 1) {
        if (v2parms[(int)base._2652_4_].version <= iVar3) {
          *oldgptr = *_k;
          _k = _k + 1;
        }
        oldgptr = oldgptr + 1;
      }
      bVar1 = *_k;
      *oldgptr = bVar1;
      _k = _k + 1;
      oldgptr = oldgptr + 1;
      for (base._2652_4_ = 0; (int)base._2652_4_ < (int)(uint)bVar1;
          base._2652_4_ = base._2652_4_ + 1) {
        *oldgptr = *_k;
        oldgptr[1] = _k[1];
        oldgptr[2] = _k[2];
        for (local_ae0 = 0; local_ae0 <= (int)(uint)oldgptr[2]; local_ae0 = local_ae0 + 1) {
          if (iVar3 < v2parms[local_ae0].version) {
            oldgptr[2] = oldgptr[2] + '\x01';
          }
        }
        oldgptr = oldgptr + 3;
        _k = _k + 3;
      }
    }
    *(int *)oldgptr = (int)base.speechdata;
    memcpy(oldgptr + 4,base.newpatchmap,(long)(int)base.speechdata);
  }
  return;
}

Assistant:

void ConvertV2M(const unsigned char *inptr, const int inlen, unsigned char **outptr, int *outlen)
{
    int i, p;
    ssbase base;
    // check version
    int vdelta = CheckV2MVersion(inptr, inlen, base);
    if (!vdelta) // if same, simply clone
    {
        *outptr = new uint8_t[inlen + 4];
        memset(*outptr, 0, inlen + 4);
        *outlen = inlen + 4;
        memcpy(*outptr, inptr, inlen);
        return;
    }
    else if (vdelta < 0) // if invalid...
    {
        *outptr = 0;
        *outlen = 0;
        return;
    }
    vdelta = v2version - vdelta;

    // fake base.maxp
    int maxp2 = ((int*)base.patchmap)[0]/4;
    if (maxp2 != base.maxp)
    {
        printf2("warning: patch count inconsistency: we:%d, they:%d\n", base.maxp, maxp2);
        base.maxp = maxp2;
    }

    // calc new size
    int gdiff = v2gsizes[v2version] - v2gsizes[vdelta];
    int pdiff = v2vsizes[v2version] - v2vsizes[vdelta];
    int newsize = inlen + gdiff + base.maxp*pdiff;
    printf2("old size: %d, new size: %d\n", inlen, newsize);

    // init new v2m
    *outlen = newsize + 4;
    uint8_t *newptr = *outptr = new uint8_t[newsize + 4];
    memset(newptr, 0, newsize + 4);

    // copy midi data
    memcpy(newptr, inptr, base.midisize);

    // new globals length...
    newptr += base.midisize;
    *(uint32_t *)newptr = v2ngparms;
    printf2("glob size: old %d, new %d\n", base.globsize, *(uint32_t *)newptr);
    newptr += 4;

    // copy/remap globals
    memcpy(newptr, v2initglobs, v2ngparms);
    const uint8_t *oldgptr = base.globals;
    for (i = 0; i < v2ngparms; i++)
    {
        if (v2gparms[i].version <= vdelta)
            newptr[i] = *oldgptr++;
    }
    newptr += v2ngparms;

    // new patch data length
    *(int *)newptr = base.patchsize + base.maxp*pdiff;
    printf2("patch size: old %d, new %d\n", base.patchsize, *(int *)newptr);
    newptr += 4;

    base.newpatchmap = newptr;

    uint32_t *poffsets = (uint32_t *)base.patchmap;
    uint32_t *noffsets = (uint32_t *)newptr;
    //const int ros = v2vsizes[vdelta] - 255*3 - 1;

    //uint8_t *nptr2 = newptr;

    // copy patch table...
    // gcc 5.3 seems to vectorize the loop, but
    // the loop is not correct for base.maxp == 10 at least
    // adding volatile to the iterator breaks the auto-vec
    for (volatile int q = 0; q < base.maxp; q++)
    {
        noffsets[q] = poffsets[q] + (q * pdiff);
    }

    newptr += 4*base.maxp;

    // for each patch...
    for (p = 0; p < base.maxp; p++)
    {
        const uint8_t *src = base.patchmap + poffsets[p];

        //const uint8_t *dest_soll = nptr2 + noffsets[p];
        printf2("p%d ist:%08x soll:%08x\n", p, newptr, dest_soll);

        // fill patch with default values
        memcpy(newptr, v2initsnd, v2nparms);

        // copy/remap patch data
        for (i = 0; i < v2nparms; i++)
        {
            if (v2parms[i].version <= vdelta)
            {
                *newptr = *src++;
                /*
                if (vdelta < 2 && (i == 33 || i == 36 || i == 39 || i == 42)) // fix envelopes
                    *newptr=transEnv(*newptr); */
            }
            newptr++;
        }

        // copy mod number
        const int modnum = *newptr ++= *src++;
        //        printf2("patch %d: %d mods\n",p,modnum);

        // copy/remap modulations
        for (i = 0; i < modnum; i++)
        {
            newptr[0] = src[0];
            newptr[1] = src[1];
            newptr[2] = src[2];
            for (int k = 0; k <= newptr[2]; k++)
                if (v2parms[k].version > vdelta) newptr[2]++;
            newptr += 3;
            src += 3;
        }
    }

    // copy speech
    *(uint32_t*)newptr = base.spsize;
    newptr += 4;
    memcpy(newptr, base.speechdata, base.spsize);
    newptr += base.spsize;

    printf2("est size: %d, real size: %d\n", newsize, newptr - *outptr);
}